

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_generator.cpp
# Opt level: O0

void __thiscall Code_generator::visit(Code_generator *this,Inst_rrx *s)

{
  Register *pRVar1;
  allocator local_39;
  string local_38;
  Inst_rrx *local_18;
  Inst_rrx *s_local;
  Code_generator *this_local;
  
  local_18 = s;
  s_local = (Inst_rrx *)this;
  ast::Instruction::check_alignment(&s->super_Instruction);
  if (7 < local_18->rn->n) {
    pRVar1 = local_18->rn;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_38,"Invalid register",&local_39);
    error_report(&pRVar1->location,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  ast::Sections::write16
            ((local_18->super_Instruction).super_Statement.section_index,
             (local_18->super_Instruction).super_Statement.section_offset,
             (short)(local_18->rn->n << 4) + -0x2800 + (short)local_18->rd->n);
  return;
}

Assistant:

void Code_generator::visit(Inst_rrx *s)
{
	s->check_alignment();
	if (s->rn->n > 7)
		error_report(&s->rn->location, "Invalid register");
	Sections::write16(s->section_index, s->section_offset,
			  static_cast<uint16_t>(RRX_OPCODE + (s->rn->n << RN_POSITION) + (s->rd->n << RD_POSITION)));
}